

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_integer_constant_expression
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    local_28 = local_18;
    local_20 = 0;
    local_18[0] = 0;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = true;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_28);
  }
  else {
    local_28 = local_18;
    local_20 = 0;
    local_18[0] = 0;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = true;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_integer_constant_expression()
{
	bool passed = true;
	if (getGLSLVersion() == glu::GLSL_VERSION_310_ES)
		return LayoutBindingTestResult(passed, String(), true);

	return LayoutBindingTestResult(passed, String(), true);
}